

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  reference pvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CppType CVar6;
  ulong uVar7;
  size_type sVar8;
  reference ppFVar9;
  FieldDescriptor *field_00;
  LogMessage *pLVar10;
  FieldGenerator *pFVar11;
  reference ppFVar12;
  string *args;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field_01;
  Iterator IVar13;
  Hex hex;
  byte local_3c6;
  byte local_3c5;
  undefined1 local_378 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  value_type oneof;
  Iterator __end3_1;
  Iterator __begin3_1;
  OneOfRangeImpl *__range3_1;
  bool have_enclosing_if;
  FieldDescriptor **field_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4_1;
  string local_2c8;
  LogFinisher local_2a2;
  byte local_2a1;
  LogMessage local_2a0;
  LogFinisher local_262;
  byte local_261;
  LogMessage local_260;
  undefined1 local_228 [12];
  AlphaNum local_218;
  undefined1 local_1e8 [8];
  string chunk_mask_str;
  uint32_t chunk_mask;
  bool have_outer_if;
  reference local_188;
  FieldDescriptor **field_1;
  iterator __end4;
  iterator __begin4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4;
  FieldDescriptor *pFStack_160;
  bool saw_non_zero_init;
  FieldDescriptor *memset_end;
  FieldDescriptor *memset_start;
  string local_148;
  reference local_128;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *chunk;
  int chunk_index;
  int cached_has_word_index;
  ColdChunkSkipper cold_skipper;
  undefined1 local_a8 [8];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  int chunk_count;
  bool merge_zero_init;
  FieldDescriptor **field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  int zero_init_bytes;
  undefined1 local_50 [4];
  int kMaxUnconditionalPrimitiveBytesClear;
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  AlphaNum *a;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar2) {
    Formatter::Formatter
              ((Formatter *)local_50,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &this->variables_);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
              );
    Formatter::Indent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
              );
    iVar4 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar4) {
      Formatter::operator()<>((Formatter *)local_50,"_extensions_.Clear();\n");
    }
    __range3._0_4_ = 0;
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(&this->optimized_order_);
    field = (FieldDescriptor **)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(&this->optimized_order_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field), bVar2) {
      ppFVar12 = __gnu_cxx::
                 __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                 ::operator*(&__end3);
      bVar2 = CanInitializeByZeroing(*ppFVar12);
      if (bVar2) {
        iVar4 = EstimateAlignmentSize(*ppFVar12);
        __range3._0_4_ = iVar4 + (int)__range3;
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 4 < (int)__range3;
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    cold_skipper._80_8_ =
         &chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (anonymous_namespace)::
    CollectFields<google::protobuf::compiler::cpp::MessageGenerator::GenerateClear(google::protobuf::io::Printer*)::__0>
              ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                *)local_a8,(_anonymous_namespace_ *)&this->optimized_order_,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&cold_skipper.limit_chunk_,(anon_class_24_3_dc47fae8 *)cold_skipper._80_8_);
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              ((ColdChunkSkipper *)&chunk_index,&this->options_,
               (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                *)local_a8,&this->has_bit_indices_,0.005);
    chunk._4_4_ = -1;
    for (chunk._0_4_ = 0; uVar7 = (ulong)(int)chunk,
        sVar8 = std::
                vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ::size((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        *)local_a8), uVar7 < sVar8; chunk._0_4_ = (int)chunk + 1) {
      local_128 = std::
                  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ::operator[]((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                *)local_a8,(long)(int)chunk);
      iVar5 = chunk._4_4_;
      iVar4 = (int)chunk;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"",(allocator *)((long)&memset_start + 7));
      anon_unknown_0::ColdChunkSkipper::OnStartChunk
                ((ColdChunkSkipper *)&chunk_index,iVar4,iVar5,&local_148,
                 (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)((long)&memset_start + 7));
      pvVar1 = local_128;
      memset_end = (FieldDescriptor *)0x0;
      pFStack_160 = (FieldDescriptor *)0x0;
      bVar2 = false;
      __end4 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::begin(local_128);
      field_1 = (FieldDescriptor **)
                std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::end(pvVar1);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                         *)&field_1), bVar3) {
        local_188 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    ::operator*(&__end4);
        bVar3 = CanInitializeByZeroing(*local_188);
        if (bVar3) {
          chunk_mask_str.field_2._M_local_buf[0xf] = '\0';
          if (bVar2) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&chunk_mask,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xccd);
            chunk_mask_str.field_2._M_local_buf[0xf] = '\x01';
            pLVar10 = internal::LogMessage::operator<<
                                ((LogMessage *)&chunk_mask,"CHECK failed: !saw_non_zero_init: ");
            internal::LogFinisher::operator=
                      ((LogFinisher *)(chunk_mask_str.field_2._M_local_buf + 0xe),pLVar10);
          }
          if ((chunk_mask_str.field_2._M_local_buf[0xf] & 1U) != 0) {
            internal::LogMessage::~LogMessage((LogMessage *)&chunk_mask);
          }
          if (memset_end == (FieldDescriptor *)0x0) {
            memset_end = *local_188;
          }
          pFStack_160 = *local_188;
        }
        else {
          bVar2 = true;
        }
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
        ::operator++(&__end4);
      }
      ppFVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::front(local_128);
      iVar4 = HasBitIndex(this,*ppFVar9);
      local_3c5 = 0;
      field_00 = extraout_RDX;
      if (iVar4 != -1) {
        sVar8 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(local_128);
        local_3c5 = 0;
        field_00 = extraout_RDX_00;
        if (1 < sVar8) {
          field_00 = (FieldDescriptor *)
                     std::
                     vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::back(local_128);
          local_3c6 = 1;
          if (pFStack_160 == *(value_type *)field_00) {
            local_3c6 = chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
          }
          local_3c5 = local_3c6;
        }
      }
      chunk_mask_str.field_2._M_local_buf[0xd] = local_3c5 & 1;
      if (chunk_mask_str.field_2._M_local_buf[0xd] != 0) {
        chunk_mask_str.field_2._8_4_ =
             anon_unknown_0::GenChunkMask(local_128,&this->has_bit_indices_);
        strings::Hex::Hex<unsigned_int>((Hex *)local_228,chunk_mask_str.field_2._8_4_,ZERO_PAD_8);
        hex._12_4_ = 0;
        hex.value = local_228._0_8_;
        hex.spec = local_228._8_4_;
        strings::AlphaNum::AlphaNum(&local_218,hex);
        StrCat_abi_cxx11_((string *)local_1e8,(protobuf *)&local_218,a);
        local_261 = 0;
        iVar4 = anon_unknown_0::popcnt(chunk_mask_str.field_2._8_4_);
        if (iVar4 < 2) {
          internal::LogMessage::LogMessage
                    (&local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xce7);
          local_261 = 1;
          pLVar10 = internal::LogMessage::operator<<
                              (&local_260,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=(&local_262,pLVar10);
        }
        if ((local_261 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_260);
        }
        local_2a1 = 0;
        iVar4 = anon_unknown_0::popcnt(chunk_mask_str.field_2._8_4_);
        if (8 < iVar4) {
          internal::LogMessage::LogMessage
                    (&local_2a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xce8);
          local_2a1 = 1;
          pLVar10 = internal::LogMessage::operator<<
                              (&local_2a0,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=(&local_2a2,pLVar10);
        }
        if ((local_2a1 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_2a0);
        }
        iVar4 = chunk._4_4_;
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::front(local_128);
        iVar5 = HasWordIndex(this,*ppFVar9);
        if (iVar4 != iVar5) {
          ppFVar9 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::front(local_128);
          chunk._4_4_ = HasWordIndex(this,*ppFVar9);
          Formatter::operator()
                    ((Formatter *)local_50,"cached_has_bits = _has_bits_[$1$];\n",
                     (int *)((long)&chunk + 4));
        }
        Formatter::operator()
                  ((Formatter *)local_50,"if (cached_has_bits & 0x$1$u) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
        Formatter::Indent((Formatter *)local_50);
        std::__cxx11::string::~string((string *)local_1e8);
        field_00 = extraout_RDX_01;
      }
      if (memset_end != (FieldDescriptor *)0x0) {
        if (memset_end == pFStack_160) {
          pFVar11 = FieldGeneratorMap::get(&this->field_generators_,memset_end);
          (*pFVar11->_vptr_FieldGenerator[0xb])
                    (pFVar11,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        else {
          FieldName_abi_cxx11_(&local_2c8,(cpp *)memset_end,field_00);
          FieldName_abi_cxx11_((string *)&__range4_1,(cpp *)pFStack_160,field_01);
          Formatter::operator()
                    ((Formatter *)local_50,
                     "::memset(&$1$_, 0, static_cast<size_t>(\n    reinterpret_cast<char*>(&$2$_) -\n    reinterpret_cast<char*>(&$1$_)) + sizeof($2$_));\n"
                     ,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range4_1);
          std::__cxx11::string::~string((string *)&__range4_1);
          std::__cxx11::string::~string((string *)&local_2c8);
        }
      }
      pvVar1 = local_128;
      __end4_1 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin(local_128);
      field_2 = (FieldDescriptor **)
                std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::end(pvVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                 *)&field_2), bVar2) {
        ppFVar12 = __gnu_cxx::
                   __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                   ::operator*(&__end4_1);
        bVar2 = CanInitializeByZeroing(*ppFVar12);
        if (!bVar2) {
          iVar4 = HasBitIndex(this,*ppFVar12);
          bVar2 = false;
          if (iVar4 != -1) {
            CVar6 = FieldDescriptor::cpp_type(*ppFVar12);
            bVar2 = true;
            if (CVar6 != CPPTYPE_MESSAGE) {
              CVar6 = FieldDescriptor::cpp_type(*ppFVar12);
              bVar2 = CVar6 == CPPTYPE_STRING;
            }
          }
          if (bVar2) {
            anon_unknown_0::PrintPresenceCheck
                      ((Formatter *)local_50,*ppFVar12,&this->has_bit_indices_,
                       (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (int *)((long)&chunk + 4));
          }
          pFVar11 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar12);
          (*pFVar11->_vptr_FieldGenerator[0xb])
                    (pFVar11,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (bVar2) {
            Formatter::Outdent((Formatter *)local_50);
            Formatter::operator()<>((Formatter *)local_50,"}\n");
          }
        }
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
        ::operator++(&__end4_1);
      }
      if ((chunk_mask_str.field_2._M_local_buf[0xd] & 1U) != 0) {
        Formatter::Outdent((Formatter *)local_50);
        Formatter::operator()<>((Formatter *)local_50,"}\n");
      }
      bVar2 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                        ((ColdChunkSkipper *)&chunk_index,(int)chunk,
                         (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar2) {
        chunk._4_4_ = -1;
      }
    }
    __begin3_1.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar13 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_1.descriptor);
    __begin3_1._0_8_ = IVar13.descriptor;
    __end3_1.descriptor._0_4_ = IVar13.idx;
    IVar13 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_1.descriptor);
    __end3_1._0_8_ = IVar13.descriptor;
    oneof._0_4_ = IVar13.idx;
    while (bVar2 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&oneof), bVar2) {
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_1.descriptor);
      args = OneofDescriptor::name_abi_cxx11_
                       ((OneofDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Formatter::operator()((Formatter *)local_50,"clear_$1$();\n",args);
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_1.descriptor);
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>((Formatter *)local_50,"_weak_field_map_.ClearAll();\n");
    }
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
    if (!bVar2) {
      Formatter::operator()<>((Formatter *)local_50,"_has_bits_.Clear();\n");
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_378);
    SetUnknownFieldsVariable
              (this->descriptor_,&this->options_,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_378);
    Formatter::AddMap((Formatter *)local_50,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_378);
    Formatter::operator()<>
              ((Formatter *)local_50,"_internal_metadata_.Clear<$unknown_fields_type$>();\n");
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"}\n");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_378);
    anon_unknown_0::ColdChunkSkipper::~ColdChunkSkipper((ColdChunkSkipper *)&chunk_index);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)local_a8);
    Formatter::~Formatter((Formatter *)local_50);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  // The maximum number of bytes we will memset to zero without checking their
  // hasbit to see if a zero-init is necessary.
  const int kMaxUnconditionalPrimitiveBytesClear = 4;

  format(
      "void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n");
  format.Indent();

  format(
      // TODO(jwb): It would be better to avoid emitting this if it is not used,
      // rather than emitting a workaround for the resulting warning.
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  if (descriptor_->extension_range_count() > 0) {
    format("_extensions_.Clear();\n");
  }

  // Collect fields into chunks. Each chunk may have an if() condition that
  // checks all hasbits in the chunk and skips it if none are set.
  int zero_init_bytes = 0;
  for (const auto& field : optimized_order_) {
    if (CanInitializeByZeroing(field)) {
      zero_init_bytes += EstimateAlignmentSize(field);
    }
  }
  bool merge_zero_init = zero_init_bytes > kMaxUnconditionalPrimitiveBytesClear;
  int chunk_count = 0;

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        chunk_count++;
        // This predicate guarantees that there is only a single zero-init
        // (memset) per chunk, and if present it will be at the beginning.
        bool same = HasByteIndex(a) == HasByteIndex(b) &&
                    a->is_repeated() == b->is_repeated() &&
                    (CanInitializeByZeroing(a) == CanInitializeByZeroing(b) ||
                     (CanInitializeByZeroing(a) &&
                      (chunk_count == 1 || merge_zero_init)));
        if (!same) chunk_count = 0;
        return same;
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    const FieldDescriptor* memset_start = nullptr;
    const FieldDescriptor* memset_end = nullptr;
    bool saw_non_zero_init = false;

    for (const auto& field : chunk) {
      if (CanInitializeByZeroing(field)) {
        GOOGLE_CHECK(!saw_non_zero_init);
        if (!memset_start) memset_start = field;
        memset_end = field;
      } else {
        saw_non_zero_init = true;
      }
    }

    // Whether we wrap this chunk in:
    //   if (cached_has_bits & <chunk hasbits) { /* chunk. */ }
    // We can omit the if() for chunk size 1, or if our fields do not have
    // hasbits. I don't understand the rationale for the last part of the
    // condition, but it matches the old logic.
    const bool have_outer_if = HasBitIndex(chunk.front()) != kNoHasbit &&
                               chunk.size() > 1 &&
                               (memset_end != chunk.back() || merge_zero_init);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    if (memset_start) {
      if (memset_start == memset_end) {
        // For clarity, do not memset a single field.
        field_generators_.get(memset_start)
            .GenerateMessageClearingCode(printer);
      } else {
        format(
            "::memset(&$1$_, 0, static_cast<size_t>(\n"
            "    reinterpret_cast<char*>(&$2$_) -\n"
            "    reinterpret_cast<char*>(&$1$_)) + sizeof($2$_));\n",
            FieldName(memset_start), FieldName(memset_end));
      }
    }

    // Clear all non-zero-initializable fields in the chunk.
    for (const auto& field : chunk) {
      if (CanInitializeByZeroing(field)) continue;
      // It's faster to just overwrite primitive types, but we should only
      // clear strings and messages if they were set.
      //
      // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
      bool have_enclosing_if =
          HasBitIndex(field) != kNoHasbit &&
          (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
           field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);

      if (have_enclosing_if) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
      }

      field_generators_.get(field).GenerateMessageClearingCode(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Step 4: Unions.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("clear_$1$();\n", oneof->name());
  }

  if (num_weak_fields_) {
    format("_weak_field_map_.ClearAll();\n");
  }

  // We don't clear donated status.

  if (!has_bit_indices_.empty()) {
    // Step 5: Everything else.
    format("_has_bits_.Clear();\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);
  format("_internal_metadata_.Clear<$unknown_fields_type$>();\n");

  format.Outdent();
  format("}\n");
}